

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

int STRING_quote(STRING_HANDLE handle)

{
  size_t __n;
  char *pcVar1;
  LOGGER_LOG p_Var2;
  size_t local_58;
  long local_50;
  ulong local_48;
  LOGGER_LOG l;
  char *temp;
  size_t realloc_size;
  size_t s1Length;
  STRING *s1;
  int result;
  STRING_HANDLE handle_local;
  
  if (handle == (STRING_HANDLE)0x0) {
    s1._4_4_ = 0x284;
  }
  else {
    __n = strlen(handle->s);
    if (__n < 0xfffffffffffffffd) {
      local_48 = __n + 2;
    }
    else {
      local_48 = 0xffffffffffffffff;
    }
    if (local_48 < 0xfffffffffffffffe) {
      if (__n < 0xfffffffffffffffd) {
        local_50 = __n + 2;
      }
      else {
        local_50 = -1;
      }
      local_58 = local_50 + 1;
    }
    else {
      local_58 = 0xffffffffffffffff;
    }
    if ((local_58 == 0xffffffffffffffff) ||
       (pcVar1 = (char *)realloc(handle->s,local_58), pcVar1 == (char *)0x0)) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                  ,"STRING_quote",0x28f,1,"Failure reallocating value. size=%zu",local_58);
      }
      s1._4_4_ = 0x291;
    }
    else {
      handle->s = pcVar1;
      memmove(handle->s + 1,handle->s,__n);
      *handle->s = '\"';
      handle->s[__n + 1] = '\"';
      handle->s[__n + 2] = '\0';
      s1._4_4_ = 0;
    }
  }
  return s1._4_4_;
}

Assistant:

int STRING_quote(STRING_HANDLE handle)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_STRING_07_015: [STRING_quote shall return a nonzero value if any of the supplied parameters are NULL.] */
        result = MU_FAILURE;
    }
    else
    {
        STRING* s1 = (STRING*)handle;
        size_t s1Length = strlen(s1->s);
        size_t realloc_size = safe_add_size_t(safe_add_size_t(s1Length, 2), 1); /*2 because 2 quotes, 1 because '\0'*/
        char* temp;
        if (realloc_size == SIZE_MAX ||
            (temp = (char*)realloc(s1->s, realloc_size)) == NULL)
        {
            LogError("Failure reallocating value. size=%zu", realloc_size);
            /* Codes_SRS_STRING_07_029: [STRING_quote shall return a nonzero value if any error is encountered.] */
            result = MU_FAILURE;
        }
        else
        {
            s1->s = temp;
            memmove(s1->s + 1, s1->s, s1Length);
            s1->s[0] = '"';
            s1->s[s1Length + 1] = '"';
            s1->s[s1Length + 2] = '\0';
            result = 0;
        }
    }
    return result;
}